

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger thread_call(HSQUIRRELVM v)

{
  SQObjectPtr *o_00;
  HSQUIRRELVM dest;
  HSQUIRRELVM pSVar1;
  HSQUIRRELVM in_RDI;
  SQInteger i;
  SQInteger nparams;
  SQObjectPtr o;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQVM *in_stack_ffffffffffffffa0;
  HSQUIRRELVM in_stack_ffffffffffffffa8;
  long local_40;
  SQBool in_stack_ffffffffffffffd0;
  SQObjectType in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  SQObjectValue in_stack_ffffffffffffffe8;
  SQVM *local_8;
  
  o_00 = stack_get(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffe0,o_00);
  if (in_stack_ffffffffffffffe0 == OT_THREAD) {
    dest = (HSQUIRRELVM)sq_gettop(in_RDI);
    pSVar1 = dest;
    SQVM::Push(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    for (local_40 = 2;
        local_40 <
        (long)((long)&(pSVar1->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1);
        local_40 = local_40 + 1) {
      sq_move(dest,in_stack_ffffffffffffffa8,(SQInteger)in_stack_ffffffffffffffa0);
    }
    pSVar1 = (HSQUIRRELVM)
             sq_call((HSQUIRRELVM)in_stack_ffffffffffffffe8.pTable,
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(SQBool)pSVar1,
                     in_stack_ffffffffffffffd0);
    if ((long)pSVar1 < 0) {
      SQObjectPtr::operator=((SQObjectPtr *)dest,(SQObjectPtr *)pSVar1);
      local_8 = (SQVM *)0xffffffffffffffff;
    }
    else {
      sq_move(dest,pSVar1,(SQInteger)in_stack_ffffffffffffffa0);
      sq_pop(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
      local_8 = (SQVM *)0x1;
    }
  }
  else {
    in_stack_ffffffffffffffa0 =
         (SQVM *)sq_throwerror(in_stack_ffffffffffffffa0,(SQChar *)in_stack_ffffffffffffff98);
    local_8 = in_stack_ffffffffffffffa0;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  return (SQInteger)local_8;
}

Assistant:

static SQInteger thread_call(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQInteger nparams = sq_gettop(v);
        _thread(o)->Push(_thread(o)->_roottable);
        for(SQInteger i = 2; i<(nparams+1); i++)
            sq_move(_thread(o),v,i);
        if(SQ_SUCCEEDED(sq_call(_thread(o),nparams,SQTrue,SQTrue))) {
            sq_move(v,_thread(o),-1);
            sq_pop(_thread(o),1);
            return 1;
        }
        v->_lasterror = _thread(o)->_lasterror;
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}